

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

void __thiscall
booster::aio::acceptor::async_accept(acceptor *this,stream_socket *target,event_handler *h)

{
  bool bVar1;
  pointer_type this_00;
  event_handler local_28;
  
  bVar1 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar1) {
    this_00.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x28);
    callable<void_(const_std::error_code_&)>::callable(this_00.p_);
    ((this_00.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__async_acceptor_001d9028;
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)(this_00.p_ + 1)
               ,&h->call_ptr);
    this_00.p_[1].super_refcounted.refs_.value_.super___atomic_base<long>._M_i = (__int_type)target;
    this_00.p_[2].super_refcounted._vptr_refcounted = (_func_int **)this;
    local_28.call_ptr.p_ = (pointer_type)(pointer_type)this_00.p_;
    atomic_counter::inc(&((this_00.p_)->super_refcounted).refs_);
    basic_io_device::on_readable((basic_io_device *)this,&local_28);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_28.call_ptr);
  }
  return;
}

Assistant:

void acceptor::async_accept(stream_socket &target,event_handler const &h)
{
	if(!dont_block(h))
		return;
	async_acceptor::pointer acceptor(new async_acceptor( h, &target, this ));
	on_readable(std::move(acceptor));
}